

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

uint Gia_Iso2ManCone_rec(Gia_Man_t *p,int Id,int Level)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj;
  int Level_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  if (Level == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar2 = Gia_ObjIsTravIdCurrentId(p,Id);
    if (iVar2 == 0) {
      Gia_ObjSetTravIdCurrentId(p,Id);
      pGVar5 = Gia_ManObj(p,Id);
      iVar2 = Gia_ObjIsAnd(pGVar5);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsPi(p,pGVar5);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsRo(p,pGVar5);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjIsConst0(pGVar5);
            if (iVar2 == 0) {
              __assert_fail("Gia_ObjIsConst0(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                            ,0xbb,"unsigned int Gia_Iso2ManCone_rec(Gia_Man_t *, int, int)");
            }
            p_local._4_4_ = pGVar5->Value;
          }
          else {
            uVar1 = pGVar5->Value;
            pGVar5 = Gia_ObjRoToRi(p,pGVar5);
            pGVar5 = Gia_ObjFanin0(pGVar5);
            iVar2 = Gia_ObjId(p,pGVar5);
            uVar3 = Gia_Iso2ManCone_rec(p,iVar2,Level);
            p_local._4_4_ = uVar1 + uVar3;
          }
        }
        else {
          p_local._4_4_ = pGVar5->Value;
        }
      }
      else {
        uVar1 = pGVar5->Value;
        iVar2 = Gia_ObjFaninId0(pGVar5,Id);
        uVar3 = Gia_Iso2ManCone_rec(p,iVar2,Level + -1);
        iVar2 = Gia_ObjFaninId1(pGVar5,Id);
        uVar4 = Gia_Iso2ManCone_rec(p,iVar2,Level + -1);
        p_local._4_4_ = uVar1 + uVar3 + uVar4;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

unsigned Gia_Iso2ManCone_rec( Gia_Man_t * p, int Id, int Level )
{
    Gia_Obj_t * pObj;
    if ( Level == 0 )
        return 0;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId0(pObj, Id), Level-1 ) + Gia_Iso2ManCone_rec( p, Gia_ObjFaninId1(pObj, Id), Level-1 );
    if ( Gia_ObjIsPi(p, pObj) )
        return pObj->Value;
    if ( Gia_ObjIsRo(p, pObj) )
        return pObj->Value + Gia_Iso2ManCone_rec( p, Gia_ObjId(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))), Level );
    assert( Gia_ObjIsConst0(pObj) );
    return pObj->Value;
}